

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool anon_unknown.dwarf_c595c9::ConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  EqualsCondition *pEVar1;
  Condition *pCVar2;
  bool bVar3;
  Value *pVVar4;
  pointer __p;
  byte unaff_BPL;
  Condition *pCVar5;
  String type;
  EqualsCondition *local_70;
  Condition *local_68;
  String local_60;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_40;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_38;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_30;
  
  pEVar1 = local_70;
  if (value == (Value *)0x0) {
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = (Condition *)0x0;
    unaff_BPL = 1;
    if (pCVar5 != (Condition *)0x0) {
      (*pCVar5->_vptr_Condition[1])();
    }
    goto LAB_002cdb9d;
  }
  bVar3 = Json::Value::isBool(value);
  if (bVar3) {
    std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    bVar3 = Json::Value::asBool(value);
    *(bool *)&((Condition *)(local_60._M_dataplus._M_p + 8))->_vptr_Condition = bVar3;
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         (Condition *)local_60._M_dataplus._M_p;
  }
  else {
    bVar3 = Json::Value::isNull(value);
    if (!bVar3) {
      bVar3 = Json::Value::isObject(value);
      if (bVar3) {
        bVar3 = Json::Value::isMember(value,"type");
        if (bVar3) {
          pVVar4 = Json::Value::operator[](value,"type");
          bVar3 = Json::Value::isString(pVVar4);
          if (bVar3) {
            pVVar4 = Json::Value::operator[](value,"type");
            Json::Value::asString_abi_cxx11_(&local_60,pVVar4);
            bVar3 = std::operator==(&local_60,"const");
            if (bVar3) {
              std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
              unaff_BPL = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::ConstCondition>::
                          operator()((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                                     (anonymous_namespace)::ConstConditionHelper,
                                     (ConstCondition *)local_70,value,state);
LAB_002cd86c:
              if ((bool)unaff_BPL == false) {
LAB_002cdb6e:
                if (local_70 != (EqualsCondition *)0x0) {
                  (*(local_70->super_Condition)._vptr_Condition[1])();
                }
              }
              else {
                local_70 = (EqualsCondition *)0x0;
                pCVar5 = (out->_M_t).
                         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                         _M_head_impl;
                (out->_M_t).
                super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                     &pEVar1->super_Condition;
                if (pCVar5 != (Condition *)0x0) {
                  (*pCVar5->_vptr_Condition[1])();
                  goto LAB_002cdb6e;
                }
              }
              bVar3 = false;
            }
            else {
              bVar3 = std::operator==(&local_60,"equals");
              if (bVar3) {
LAB_002cd8c9:
                std::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
                unaff_BPL = cmJSONHelperBuilder::
                            Object<cmCMakePresetsGraphInternal::EqualsCondition>::operator()
                                      ((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                                       (anonymous_namespace)::EqualsConditionHelper,local_70,value,
                                       state);
                if ((bool)unaff_BPL) {
                  local_70 = (EqualsCondition *)0x0;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       &pEVar1->super_Condition;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
                  bVar3 = std::operator==(&local_60,"notEquals");
                  if (bVar3) {
                    local_30._M_head_impl =
                         (out->_M_t).
                         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                         _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         (Condition *)0x0;
                    InvertCondition((anon_unknown_dwarf_c595c9 *)&local_68,
                                    (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&local_30);
                    pCVar2 = local_68;
                    local_68 = (Condition *)0x0;
                    pCVar5 = (out->_M_t).
                             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                             _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         pCVar2;
                    if (pCVar5 != (Condition *)0x0) {
                      (*pCVar5->_vptr_Condition[1])();
                      if (local_68 != (Condition *)0x0) {
                        (**(code **)(*(long *)local_68 + 8))();
                      }
                    }
                    local_68 = (Condition *)0x0;
                    if (local_30._M_head_impl != (Condition *)0x0) {
                      (*(local_30._M_head_impl)->_vptr_Condition[1])();
                    }
                    local_30._M_head_impl = (Condition *)0x0;
                  }
                }
                goto LAB_002cdb6e;
              }
              bVar3 = std::operator==(&local_60,"notEquals");
              if (bVar3) goto LAB_002cd8c9;
              bVar3 = std::operator==(&local_60,"inList");
              if (bVar3) {
LAB_002cd9bd:
                std::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
                unaff_BPL = cmJSONHelperBuilder::
                            Object<cmCMakePresetsGraphInternal::InListCondition>::operator()
                                      ((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                                       (anonymous_namespace)::InListConditionHelper,
                                       (InListCondition *)local_70,value,state);
                if ((bool)unaff_BPL) {
                  local_70 = (EqualsCondition *)0x0;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       &pEVar1->super_Condition;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
                  bVar3 = std::operator==(&local_60,"notInList");
                  if (bVar3) {
                    local_38._M_head_impl =
                         (out->_M_t).
                         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                         _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         (Condition *)0x0;
                    InvertCondition((anon_unknown_dwarf_c595c9 *)&local_68,
                                    (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&local_38);
                    pCVar2 = local_68;
                    local_68 = (Condition *)0x0;
                    pCVar5 = (out->_M_t).
                             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                             _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         pCVar2;
                    if (pCVar5 != (Condition *)0x0) {
                      (*pCVar5->_vptr_Condition[1])();
                      if (local_68 != (Condition *)0x0) {
                        (**(code **)(*(long *)local_68 + 8))();
                      }
                    }
                    local_68 = (Condition *)0x0;
                    if (local_38._M_head_impl != (Condition *)0x0) {
                      (*(local_38._M_head_impl)->_vptr_Condition[1])();
                    }
                    local_38._M_head_impl = (Condition *)0x0;
                  }
                }
                goto LAB_002cdb6e;
              }
              bVar3 = std::operator==(&local_60,"notInList");
              if (bVar3) goto LAB_002cd9bd;
              bVar3 = std::operator==(&local_60,"matches");
              if (bVar3) {
LAB_002cdab1:
                std::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
                unaff_BPL = cmJSONHelperBuilder::
                            Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                                      ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                                       (anonymous_namespace)::MatchesConditionHelper,
                                       (MatchesCondition *)local_70,value,state);
                if ((bool)unaff_BPL) {
                  local_70 = (EqualsCondition *)0x0;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       &pEVar1->super_Condition;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
                  bVar3 = std::operator==(&local_60,"notMatches");
                  if (bVar3) {
                    local_40._M_head_impl =
                         (out->_M_t).
                         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                         _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         (Condition *)0x0;
                    InvertCondition((anon_unknown_dwarf_c595c9 *)&local_68,
                                    (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&local_40);
                    pCVar2 = local_68;
                    local_68 = (Condition *)0x0;
                    pCVar5 = (out->_M_t).
                             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                             _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         pCVar2;
                    if (pCVar5 != (Condition *)0x0) {
                      (*pCVar5->_vptr_Condition[1])();
                      if (local_68 != (Condition *)0x0) {
                        (**(code **)(*(long *)local_68 + 8))();
                      }
                    }
                    local_68 = (Condition *)0x0;
                    if (local_40._M_head_impl != (Condition *)0x0) {
                      (*(local_40._M_head_impl)->_vptr_Condition[1])();
                    }
                    local_40._M_head_impl = (Condition *)0x0;
                  }
                }
                goto LAB_002cdb6e;
              }
              bVar3 = std::operator==(&local_60,"notMatches");
              if (bVar3) goto LAB_002cdab1;
              bVar3 = std::operator==(&local_60,"anyOf");
              if (bVar3) {
LAB_002cdbda:
                std::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
                bVar3 = std::operator==(&local_60,"anyOf");
                *(bool *)((long)(local_70->Lhs).field_2._M_local_buf + 8) = bVar3;
                unaff_BPL = cmJSONHelperBuilder::
                            Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::operator()
                                      ((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                                       (anonymous_namespace)::AnyAllOfConditionHelper,
                                       (AnyAllOfCondition *)local_70,value,state);
                goto LAB_002cd86c;
              }
              bVar3 = std::operator==(&local_60,"allOf");
              if (bVar3) goto LAB_002cdbda;
              bVar3 = std::operator==(&local_60,"not");
              if (bVar3) {
                std::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
                unaff_BPL = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::NotCondition>::
                            operator()((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                                       (anonymous_namespace)::NotConditionHelper,
                                       (NotCondition *)local_70,value,state);
                goto LAB_002cd86c;
              }
              bVar3 = true;
            }
            std::__cxx11::string::~string((string *)&local_60);
            if (!bVar3) goto LAB_002cdb9d;
          }
        }
      }
      cmCMakePresetsErrors::INVALID_CONDITION(value,state);
      unaff_BPL = 0;
      goto LAB_002cdb9d;
    }
    std::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         (Condition *)local_60._M_dataplus._M_p;
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (pCVar5 != (Condition *)0x0) {
    (*pCVar5->_vptr_Condition[1])();
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  unaff_BPL = 1;
LAB_002cdb9d:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                     const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out.reset();
    return true;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return true;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return true;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }

    if (!(*value)["type"].isString()) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }
  }

  cmCMakePresetsErrors::INVALID_CONDITION(value, state);
  return false;
}